

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

string * __thiscall
cmMakefile::GetModulesFile_abi_cxx11_
          (string *__return_storage_ptr__,cmMakefile *this,char *filename)

{
  bool bVar1;
  PolicyStatus PVar2;
  char *pcVar3;
  string *__lhs;
  ostream *poVar4;
  PolicyID id;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  modulePath;
  string moduleInCMakeRoot;
  string local_1e8;
  string moduleInCMakeModulePath;
  string itempl;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  moduleInCMakeRoot._M_dataplus._M_p = (pointer)&moduleInCMakeRoot.field_2;
  moduleInCMakeRoot._M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  moduleInCMakeRoot.field_2._M_local_buf[0] = '\0';
  moduleInCMakeModulePath._M_dataplus._M_p = (pointer)&moduleInCMakeModulePath.field_2;
  moduleInCMakeModulePath._M_string_length = 0;
  moduleInCMakeModulePath.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&itempl,"CMAKE_MODULE_PATH",(allocator *)&modulePath);
  pcVar3 = GetDefinition(this,&itempl);
  std::__cxx11::string::~string((string *)&itempl);
  if (pcVar3 != (char *)0x0) {
    modulePath.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    modulePath.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    modulePath.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&itempl,pcVar3,(allocator *)&local_1e8);
    cmSystemTools::ExpandListArgument(&itempl,&modulePath,false);
    std::__cxx11::string::~string((string *)&itempl);
    for (pbVar5 = modulePath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar5 != modulePath.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar5 = pbVar5 + 1) {
      std::__cxx11::string::string((string *)&itempl,(string *)pbVar5);
      cmsys::SystemTools::ConvertToUnixSlashes(&itempl);
      std::__cxx11::string::append((char *)&itempl);
      std::__cxx11::string::append((char *)&itempl);
      bVar1 = cmsys::SystemTools::FileExists(itempl._M_dataplus._M_p);
      if (bVar1) {
        std::__cxx11::string::_M_assign((string *)&moduleInCMakeModulePath);
        std::__cxx11::string::~string((string *)&itempl);
        break;
      }
      std::__cxx11::string::~string((string *)&itempl);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&modulePath);
  }
  cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::__cxx11::string::_M_assign((string *)&moduleInCMakeRoot);
  std::__cxx11::string::append((char *)&moduleInCMakeRoot);
  std::__cxx11::string::append((char *)&moduleInCMakeRoot);
  cmsys::SystemTools::ConvertToUnixSlashes(&moduleInCMakeRoot);
  bVar1 = cmsys::SystemTools::FileExists(moduleInCMakeRoot._M_dataplus._M_p);
  if (!bVar1) {
    std::__cxx11::string::assign((char *)&moduleInCMakeRoot);
  }
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  if (__return_storage_ptr__->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  if ((moduleInCMakeModulePath._M_string_length == 0) || (moduleInCMakeRoot._M_string_length == 0))
  goto LAB_0037da18;
  std::__cxx11::string::string((string *)&itempl,"CMAKE_CURRENT_LIST_FILE",(allocator *)&modulePath)
  ;
  pcVar3 = GetDefinition(this,&itempl);
  std::__cxx11::string::~string((string *)&itempl);
  __lhs = cmSystemTools::GetCMakeRoot_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&modulePath,
                 __lhs,"/Modules/");
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::string((string *)&itempl,pcVar3,(allocator *)&local_1e8);
    bVar1 = cmsys::SystemTools::IsSubDirectory(&itempl,(string *)&modulePath);
    std::__cxx11::string::~string((string *)&itempl);
    if (bVar1) {
      PVar2 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0017);
      if ((2 < PVar2 - NEW) && (PVar2 != OLD)) {
        if (PVar2 != WARN) goto LAB_0037da10;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&itempl);
        poVar4 = std::operator<<((ostream *)&itempl,"File ");
        poVar4 = std::operator<<(poVar4,pcVar3);
        poVar4 = std::operator<<(poVar4," includes ");
        poVar4 = std::operator<<(poVar4,(string *)&moduleInCMakeModulePath);
        poVar4 = std::operator<<(poVar4," (found via CMAKE_MODULE_PATH) which shadows ");
        poVar4 = std::operator<<(poVar4,(string *)&moduleInCMakeRoot);
        poVar4 = std::operator<<(poVar4,". This may cause errors later on .\n");
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1e8,(cmPolicies *)0x11,id);
        std::operator<<(poVar4,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::stringbuf::str();
        IssueMessage(this,AUTHOR_WARNING,&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&itempl);
      }
      std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    }
  }
LAB_0037da10:
  std::__cxx11::string::~string((string *)&modulePath);
LAB_0037da18:
  std::__cxx11::string::~string((string *)&moduleInCMakeModulePath);
  std::__cxx11::string::~string((string *)&moduleInCMakeRoot);
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefile::GetModulesFile(const char* filename) const
{
  std::string result;

  // We search the module always in CMAKE_ROOT and in CMAKE_MODULE_PATH,
  // and then decide based on the policy setting which one to return.
  // See CMP0017 for more details.
  // The specific problem was that KDE 4.5.0 installs a
  // FindPackageHandleStandardArgs.cmake which doesn't have the new features
  // of FPHSA.cmake introduced in CMake 2.8.3 yet, and by setting
  // CMAKE_MODULE_PATH also e.g. FindZLIB.cmake from cmake included
  // FPHSA.cmake from kdelibs and not from CMake, and tried to use the
  // new features, which were not there in the version from kdelibs, and so
  // failed ("
  std::string moduleInCMakeRoot;
  std::string moduleInCMakeModulePath;

  // Always search in CMAKE_MODULE_PATH:
  const char* cmakeModulePath = this->GetDefinition("CMAKE_MODULE_PATH");
  if (cmakeModulePath) {
    std::vector<std::string> modulePath;
    cmSystemTools::ExpandListArgument(cmakeModulePath, modulePath);

    // Look through the possible module directories.
    for (std::vector<std::string>::iterator i = modulePath.begin();
         i != modulePath.end(); ++i) {
      std::string itempl = *i;
      cmSystemTools::ConvertToUnixSlashes(itempl);
      itempl += "/";
      itempl += filename;
      if (cmSystemTools::FileExists(itempl.c_str())) {
        moduleInCMakeModulePath = itempl;
        break;
      }
    }
  }

  // Always search in the standard modules location.
  moduleInCMakeRoot = cmSystemTools::GetCMakeRoot();
  moduleInCMakeRoot += "/Modules/";
  moduleInCMakeRoot += filename;
  cmSystemTools::ConvertToUnixSlashes(moduleInCMakeRoot);
  if (!cmSystemTools::FileExists(moduleInCMakeRoot.c_str())) {
    moduleInCMakeRoot = "";
  }

  // Normally, prefer the files found in CMAKE_MODULE_PATH. Only when the file
  // from which we are being called is located itself in CMAKE_ROOT, then
  // prefer results from CMAKE_ROOT depending on the policy setting.
  result = moduleInCMakeModulePath;
  if (result.empty()) {
    result = moduleInCMakeRoot;
  }

  if (!moduleInCMakeModulePath.empty() && !moduleInCMakeRoot.empty()) {
    const char* currentFile = this->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    std::string mods = cmSystemTools::GetCMakeRoot() + "/Modules/";
    if (currentFile && cmSystemTools::IsSubDirectory(currentFile, mods)) {
      switch (this->GetPolicyStatus(cmPolicies::CMP0017)) {
        case cmPolicies::WARN: {
          std::ostringstream e;
          /* clang-format off */
          e << "File " << currentFile << " includes "
            << moduleInCMakeModulePath
            << " (found via CMAKE_MODULE_PATH) which shadows "
            << moduleInCMakeRoot  << ". This may cause errors later on .\n"
            << cmPolicies::GetPolicyWarning(cmPolicies::CMP0017);
          /* clang-format on */

          this->IssueMessage(cmake::AUTHOR_WARNING, e.str());
          CM_FALLTHROUGH;
        }
        case cmPolicies::OLD:
          result = moduleInCMakeModulePath;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          result = moduleInCMakeRoot;
          break;
      }
    }
  }

  return result;
}